

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rect nk_layout_space_bounds(nk_context *ctx)

{
  nk_panel *pnVar1;
  nk_rect nVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  nk_rect ret;
  
  pnVar1 = ctx->current->layout;
  uVar3 = (pnVar1->clip).x;
  uVar4 = (pnVar1->clip).y;
  uVar5 = (pnVar1->clip).w;
  nVar2.w = (float)uVar5;
  nVar2.y = (float)uVar4;
  nVar2.x = (float)uVar3;
  nVar2.h = (pnVar1->row).height;
  return nVar2;
}

Assistant:

NK_API struct nk_rect
nk_layout_space_bounds(struct nk_context *ctx)
{
struct nk_rect ret;
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
win = ctx->current;
layout = win->layout;

ret.x = layout->clip.x;
ret.y = layout->clip.y;
ret.w = layout->clip.w;
ret.h = layout->row.height;
return ret;
}